

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_radix_scatter.cpp
# Opt level: O3

void duckdb::RadixScatterStructVector
               (Vector *v,UnifiedVectorFormat *vdata,idx_t vcount,SelectionVector *sel,
               idx_t add_count,data_ptr_t *key_locations,bool desc,bool has_null,bool nulls_first,
               idx_t prefix_len,idx_t width,idx_t offset)

{
  sel_t *psVar1;
  unsigned_long *puVar2;
  idx_t iVar3;
  ulong uVar4;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  reference this_00;
  type v_00;
  SelectionVector *sel_00;
  idx_t iVar5;
  idx_t iVar6;
  ulong uVar7;
  
  if ((has_null) && (width = width - 1, add_count != 0)) {
    uVar7 = 0;
    do {
      uVar4 = uVar7;
      if (sel->sel_vector != (sel_t *)0x0) {
        uVar4 = (ulong)sel->sel_vector[uVar7];
      }
      psVar1 = vdata->sel->sel_vector;
      if (psVar1 != (sel_t *)0x0) {
        uVar4 = (ulong)psVar1[uVar4];
      }
      puVar2 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar2 == (unsigned_long *)0x0) ||
         ((puVar2[uVar4 + offset >> 6] >> (uVar4 + offset & 0x3f) & 1) != 0)) {
        *key_locations[uVar7] = nulls_first;
      }
      else {
        *key_locations[uVar7] = !nulls_first;
        switchD_010444a0::default(key_locations[uVar7] + 1,0,width);
      }
      key_locations[uVar7] = key_locations[uVar7] + 1;
      uVar7 = uVar7 + 1;
    } while (add_count != uVar7);
  }
  this = StructVector::GetEntries(v);
  this_00 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
            ::operator[](this,0);
  v_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this_00);
  sel_00 = FlatVector::IncrementalSelectionVector();
  RowOperations::RadixScatter
            (v_00,vcount,sel_00,add_count,key_locations,false,true,false,prefix_len,width,offset);
  if (desc && add_count != 0) {
    iVar5 = 0;
    iVar6 = -width;
    iVar3 = width;
    do {
      while (iVar3 != 0) {
        key_locations[iVar5][iVar6] = ~key_locations[iVar5][iVar6];
        iVar6 = iVar6 + 1;
        iVar3 = iVar6;
      }
      iVar5 = iVar5 + 1;
      iVar6 = -width;
      iVar3 = width;
    } while (iVar5 != add_count);
  }
  return;
}

Assistant:

void RadixScatterStructVector(Vector &v, UnifiedVectorFormat &vdata, idx_t vcount, const SelectionVector &sel,
                              idx_t add_count, data_ptr_t *key_locations, const bool desc, const bool has_null,
                              const bool nulls_first, const idx_t prefix_len, idx_t width, const idx_t offset) {
	// serialize null values
	if (has_null) {
		auto &validity = vdata.validity;
		const data_t valid = nulls_first ? 1 : 0;
		const data_t invalid = 1 - valid;

		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;

			// write validity and according value
			if (validity.RowIsValid(source_idx)) {
				key_locations[i][0] = valid;
			} else {
				key_locations[i][0] = invalid;
				memset(key_locations[i] + 1, '\0', width - 1);
			}
			key_locations[i]++;
		}
		width--;
	}
	// serialize the struct
	auto &child_vector = *StructVector::GetEntries(v)[0];
	RowOperations::RadixScatter(child_vector, vcount, *FlatVector::IncrementalSelectionVector(), add_count,
	                            key_locations, false, true, false, prefix_len, width, offset);
	// invert bits if desc
	if (desc) {
		for (idx_t i = 0; i < add_count; i++) {
			for (idx_t s = 0; s < width; s++) {
				*(key_locations[i] - width + s) = ~*(key_locations[i] - width + s);
			}
		}
	}
}